

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O3

Attachment *
deqp::gls::fboc::details::makeAttachment
          (GLenum bufType,ImageFormat format,GLsizei width,GLsizei height,FboBuilder *builder)

{
  GLuint GVar1;
  Image *pIVar2;
  Renderbuffer *rbCfg;
  Attachment *pAVar3;
  Texture *texCfg;
  Attachment *local_28;
  
  pIVar2 = makeImage(bufType,format,width,height,builder);
  if (pIVar2 == (Image *)0x0) {
    pAVar3 = (Attachment *)0x0;
  }
  else {
    rbCfg = (Renderbuffer *)
            __dynamic_cast(pIVar2,&FboUtil::config::Image::typeinfo,
                           &FboUtil::config::Renderbuffer::typeinfo,0);
    if (rbCfg == (Renderbuffer *)0x0) {
      texCfg = (Texture *)
               __dynamic_cast(pIVar2,&FboUtil::config::Image::typeinfo,
                              &FboUtil::config::Texture2D::typeinfo,0);
      if (texCfg == (Texture *)0x0) {
        return (Attachment *)0x0;
      }
      GVar1 = FboUtil::FboBuilder::glCreateTexture(builder,texCfg);
      pAVar3 = (Attachment *)
               FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::TextureFlatAttachment>
                         (builder);
      *(undefined4 *)((long)&pAVar3[1].super_Config._vptr_Config + 4) = 0xde1;
    }
    else {
      GVar1 = FboUtil::FboBuilder::glCreateRbo(builder,rbCfg);
      pAVar3 = (Attachment *)operator_new(0x18);
      pAVar3->target = 0x8d40;
      pAVar3->imageName = 0;
      (((TextureAttachment *)&pAVar3->super_Config)->super_Attachment).super_Config._vptr_Config =
           (_func_int **)&PTR__Config_02149220;
      *(GLint *)&pAVar3[1].super_Config._vptr_Config = 0x8d41;
      local_28 = pAVar3;
      std::
      _Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
      ::_M_insert_unique<deqp::gls::FboUtil::config::Config*>
                ((_Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
                  *)&builder->m_configs,(Config **)&local_28);
    }
    pAVar3->imageName = GVar1;
  }
  return pAVar3;
}

Assistant:

Attachment* makeAttachment (GLenum bufType, ImageFormat format,
							GLsizei width, GLsizei height, FboBuilder& builder)
{
	Image* const imgCfg = makeImage (bufType, format, width, height, builder);
	Attachment* att = DE_NULL;
	GLuint img = 0;

	if (Renderbuffer* rboCfg = dynamic_cast<Renderbuffer*>(imgCfg))
	{
		img = builder.glCreateRbo(*rboCfg);
		att = &builder.makeConfig<RenderbufferAttachment>();
	}
	else if (Texture2D* texCfg = dynamic_cast<Texture2D*>(imgCfg))
	{
		img = builder.glCreateTexture(*texCfg);
		TextureFlatAttachment& texAtt = builder.makeConfig<TextureFlatAttachment>();
		texAtt.texTarget = GL_TEXTURE_2D;
		att = &texAtt;
	}
	else
	{
		DE_ASSERT(imgCfg == DE_NULL);
		return DE_NULL;
	}
	att->imageName = img;
	return att;
}